

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

int mi_reserve_huge_os_pages_interleave(size_t pages,size_t numa_nodes,size_t timeout_msecs)

{
  int iVar1;
  size_t in_RSI;
  ulong in_RDI;
  int err;
  size_t node_pages;
  size_t numa_node;
  size_t timeout_per;
  size_t pages_mod;
  size_t pages_per;
  size_t numa_count;
  int in_stack_ffffffffffffff8c;
  undefined7 in_stack_ffffffffffffff90;
  size_t local_60;
  ulong local_50;
  ulong local_48;
  ulong local_28;
  ulong local_10;
  
  if (in_RDI != 0) {
    local_60 = in_RSI;
    if (in_RSI == 0) {
      local_60 = _mi_os_numa_node_count();
    }
    local_28 = local_60;
    if (local_60 == 0) {
      local_28 = 1;
    }
    local_10 = in_RDI;
    for (local_48 = 0; local_48 < local_28 && local_10 != 0; local_48 = local_48 + 1) {
      local_50 = in_RDI / local_28;
      if (local_48 < in_RDI % local_28) {
        local_50 = in_RDI / local_28 + 1;
      }
      iVar1 = mi_reserve_huge_os_pages_at
                        (CONCAT17(local_48 < local_28 && local_10 != 0,in_stack_ffffffffffffff90),
                         in_stack_ffffffffffffff8c,0x14c54f8);
      if (iVar1 != 0) {
        return iVar1;
      }
      if (local_10 < local_50) {
        local_10 = 0;
      }
      else {
        local_10 = local_10 - local_50;
      }
    }
  }
  return 0;
}

Assistant:

int mi_reserve_huge_os_pages_interleave(size_t pages, size_t numa_nodes, size_t timeout_msecs) mi_attr_noexcept {
  if (pages == 0) return 0;

  // pages per numa node
  size_t numa_count = (numa_nodes > 0 ? numa_nodes : _mi_os_numa_node_count());
  if (numa_count <= 0) numa_count = 1;
  const size_t pages_per = pages / numa_count;
  const size_t pages_mod = pages % numa_count;
  const size_t timeout_per = (timeout_msecs==0 ? 0 : (timeout_msecs / numa_count) + 50);

  // reserve evenly among numa nodes
  for (size_t numa_node = 0; numa_node < numa_count && pages > 0; numa_node++) {
    size_t node_pages = pages_per;  // can be 0
    if (numa_node < pages_mod) node_pages++;
    int err = mi_reserve_huge_os_pages_at(node_pages, (int)numa_node, timeout_per);
    if (err) return err;
    if (pages < node_pages) {
      pages = 0;
    }
    else {
      pages -= node_pages;
    }
  }

  return 0;
}